

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

bool libtorrent::aux::string_begins_no_case(char *s1,char *s2)

{
  long lVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  cVar2 = *s1;
  if (cVar2 == '\0') {
    return true;
  }
  lVar1 = 0;
  while( true ) {
    cVar3 = cVar2 + ' ';
    if (0x19 < (byte)(cVar2 + 0xbfU)) {
      cVar3 = cVar2;
    }
    cVar2 = s2[lVar1];
    cVar4 = cVar2 + ' ';
    if (0x19 < (byte)(cVar2 + 0xbfU)) {
      cVar4 = cVar2;
    }
    bVar5 = cVar3 == cVar4;
    if (!bVar5) break;
    cVar2 = s1[lVar1 + 1];
    lVar1 = lVar1 + 1;
    if (cVar2 == '\0') {
      return bVar5;
    }
  }
  return bVar5;
}

Assistant:

bool string_begins_no_case(char const* s1, char const* s2)
	{
		TORRENT_ASSERT(s1 != nullptr);
		TORRENT_ASSERT(s2 != nullptr);

		while (*s1 != 0)
		{
			if (to_lower(*s1) != to_lower(*s2)) return false;
			++s1;
			++s2;
		}
		return true;
	}